

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meassure_recv.c
# Opt level: O3

void * receiver(void *_)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  timespec t0;
  timespec local_30;
  
  clock_gettime(1,&local_30);
  sched_yield();
  sVar2 = (*meassure)(__cxa_finalize);
  *payload = sVar2;
  if (length != 1) {
    sVar2 = 1;
    do {
      uVar1 = (int)local_30.tv_nsec + (int)interval;
      if (999999999 < uVar1) {
        uVar1 = uVar1 + 0xc4653600;
        local_30.tv_sec = local_30.tv_sec + 1;
      }
      local_30.tv_nsec = (long)uVar1;
      clock_nanosleep(1,1,&local_30,(timespec *)0x0);
      sched_yield();
      sVar3 = (*meassure)(__cxa_finalize);
      payload[sVar2] = sVar3;
      sVar2 = sVar2 + 1;
    } while (sVar2 != length);
  }
  return (void *)0x0;
}

Assistant:

void* receiver(void* _)
{
    INIT_CLOCK
    int i = 0;

    while(1)
    {
        sched_yield();
        size_t d = meassure(function + 64);

        payload[i++] = d;

        if(i == length)
            return NULL;

        WAIT_FOR_CLOCK
    }
}